

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void * xmalloc(size_t size)

{
  void *pvVar1;
  
  if (size != 0) {
    pvVar1 = malloc(size);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    xmalloc_cold_1();
  }
  return (void *)0x0;
}

Assistant:

static inline void* xmalloc(size_t size) {
    if (size == 0)
        return NULL;
    void* ptr = malloc(size);
    if (!ptr)
        die("not enough memory");
    return ptr;
}